

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIrrDeviceSDL.cpp
# Opt level: O1

bool __thiscall irr::CIrrDeviceSDL::isWindowActive(CIrrDeviceSDL *this)

{
  uint uVar1;
  
  uVar1 = SDL_GetWindowFlags(*(undefined8 *)&(this->super_CIrrDeviceStub).field_0xf8);
  return (~uVar1 & 0x204) == 0;
}

Assistant:

bool CIrrDeviceSDL::isWindowActive() const
{
#ifdef _IRR_EMSCRIPTEN_PLATFORM_
	// Hidden test only does something in some browsers (when tab in background or window is minimized)
	// In other browsers code automatically doesn't seem to be called anymore.
	EmscriptenVisibilityChangeEvent emVisibility;
	if (emscripten_get_visibility_status(&emVisibility) == EMSCRIPTEN_RESULT_SUCCESS) {
		if (emVisibility.hidden)
			return false;
	}
#endif
	const u32 windowFlags = SDL_GetWindowFlags(Window);
	return windowFlags & SDL_WINDOW_SHOWN && windowFlags & SDL_WINDOW_INPUT_FOCUS;
}